

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void Utils::calculate_distances(void)

{
  Point *this;
  Point *p;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  double dVar3;
  
  for (p_Var2 = raw_rows_abi_cxx11_.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&raw_rows_abi_cxx11_;
      p_Var2 = (((_List_base<Point_*,_std::allocator<Point_*>_> *)&p_Var2->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    if (raw_rows_abi_cxx11_.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&raw_rows_abi_cxx11_) {
      this = (Point *)p_Var2[1]._M_next;
      p_Var1 = raw_rows_abi_cxx11_.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      do {
        p = (Point *)p_Var1[1]._M_next;
        dVar3 = Point::distance(this,p);
        distances[this->id][p->id] = dVar3;
        p_Var1 = (((_List_base<Point_*,_std::allocator<Point_*>_> *)&p_Var1->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next;
      } while (p_Var1 != (_List_node_base *)&raw_rows_abi_cxx11_);
    }
  }
  return;
}

Assistant:

void Utils::calculate_distances() {
    for (Point *point: Utils::raw_rows) {
        for (Point *point2: Utils::raw_rows) {
            Utils::distances[point->id][point2->id] = point->distance(point2);
        }
    }
}